

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_cd.cpp
# Opt level: O1

void __thiscall CDSong::CDSong(CDSong *this,int track,int id)

{
  bool bVar1;
  
  MusInfo::MusInfo(&this->super_MusInfo);
  (this->super_MusInfo)._vptr_MusInfo = (_func_int **)&PTR__CDSong_006f40a8;
  this->m_Inited = false;
  if (id == 0) {
    bVar1 = CD_Init();
  }
  else {
    bVar1 = CD_InitID(id,-1);
  }
  if (bVar1 != false) {
    if ((track != 0) && (bVar1 = CD_CheckTrack(track), !bVar1)) {
      return;
    }
    this->m_Inited = true;
    this->m_Track = track;
  }
  return;
}

Assistant:

CDSong::CDSong (int track, int id)
{
	bool success;

	m_Inited = false;

	if (id != 0)
	{
		success = CD_InitID (id);
	}
	else
	{
		success = CD_Init ();
	}

	if (success && (track == 0 || CD_CheckTrack (track)))
	{
		m_Inited = true;
		m_Track = track;
	}
}